

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O1

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<64U,_unsigned_int,_void,_false>::operator+=
          (uintwide_t<64U,_unsigned_int,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other)

{
  unsigned_fast_type i;
  long lVar1;
  ulong uVar2;
  uintwide_t<24U,_unsigned_char,_void,_false> self;
  
  if (this == (uintwide_t<64U,_unsigned_int,_void,_false> *)other) {
    _self = *(undefined8 *)other;
    lVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = (ulong)*(uint *)((long)&self + lVar1 * 4) +
              (this->values).super_array<unsigned_int,_2UL>.elems[lVar1] + uVar2;
      (this->values).super_array<unsigned_int,_2UL>.elems[lVar1] = (value_type_conflict)uVar2;
      uVar2 = uVar2 >> 0x20;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 2);
  }
  else {
    lVar1 = 0;
    uVar2 = 0;
    do {
      uVar2 = (ulong)*(uint *)((long)other + lVar1 * 4) +
              (this->values).super_array<unsigned_int,_2UL>.elems[lVar1] + uVar2;
      (this->values).super_array<unsigned_int,_2UL>.elems[lVar1] = (value_type_conflict)uVar2;
      uVar2 = uVar2 >> 0x20;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 2);
  }
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto operator+=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t self(other); // NOLINT(performance-unnecessary-copy-initialization)

        // Unary addition function.
        const auto carry = eval_add_n(values.begin(), // LCOV_EXCL_LINE
                                      values.cbegin(),
                                      self.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }
      else
      {
        // Unary addition function.
        const auto carry = eval_add_n(values.begin(),
                                      values.cbegin(),
                                      other.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }

      return *this;
    }